

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

TimingPathSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::TimingPathSymbol,slang::SourceLocation,slang::ast::TimingPathSymbol::ConnectionKind&,slang::ast::TimingPathSymbol::Polarity&,slang::ast::TimingPathSymbol::Polarity&,slang::ast::EdgeKind&>
          (BumpAllocator *this,SourceLocation *args,ConnectionKind *args_1,Polarity *args_2,
          Polarity *args_3,EdgeKind *args_4)

{
  ConnectionKind CVar1;
  Polarity PVar2;
  Polarity PVar3;
  EdgeKind EVar4;
  SourceLocation SVar5;
  TimingPathSymbol *pTVar6;
  
  pTVar6 = (TimingPathSymbol *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((TimingPathSymbol *)this->endPtr < pTVar6 + 1) {
    pTVar6 = (TimingPathSymbol *)allocateSlow(this,0x98,8);
  }
  else {
    this->head->current = (byte *)(pTVar6 + 1);
  }
  SVar5 = *args;
  CVar1 = *args_1;
  PVar2 = *args_2;
  PVar3 = *args_3;
  EVar4 = *args_4;
  (pTVar6->super_Symbol).kind = TimingPath;
  (pTVar6->super_Symbol).name._M_len = 0;
  (pTVar6->super_Symbol).name._M_str = "";
  (pTVar6->super_Symbol).location = SVar5;
  (pTVar6->super_Symbol).originatingSyntax = (SyntaxNode *)0x0;
  (pTVar6->super_Symbol).parentScope = (Scope *)0x0;
  (pTVar6->super_Symbol).nextInScope = (Symbol *)0x0;
  (pTVar6->super_Symbol).indexInScope = 0;
  pTVar6->connectionKind = CVar1;
  pTVar6->polarity = PVar2;
  pTVar6->edgePolarity = PVar3;
  pTVar6->edgeIdentifier = EVar4;
  pTVar6->isStateDependent = false;
  pTVar6->isResolved = false;
  pTVar6->edgeSourceExpr = (Expression *)0x0;
  pTVar6->conditionExpr = (Expression *)0x0;
  (pTVar6->inputs)._M_ptr = (pointer)0x0;
  (pTVar6->inputs)._M_extent._M_extent_value = 0;
  (pTVar6->outputs)._M_ptr = (pointer)0x0;
  (pTVar6->outputs)._M_extent._M_extent_value = 0;
  (pTVar6->delays)._M_ptr = (pointer)0x0;
  (pTVar6->delays)._M_extent._M_extent_value = 0;
  return pTVar6;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }